

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

String * __thiscall
capnp::JsonCodec::encode(String *__return_storage_ptr__,JsonCodec *this,Reader *value,Type type)

{
  Builder output;
  Reader value_00;
  Builder json;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  Reader local_168;
  MallocMessageBuilder message;
  
  MallocMessageBuilder::MallocMessageBuilder(&message,0x400,GROW_HEURISTICALLY);
  MessageBuilder::getRoot<capnp::json::Value>(&json,&message.super_MessageBuilder);
  DynamicValue::Reader::Reader(&local_168,value);
  output._builder.capTable = json._builder.capTable;
  output._builder.segment = json._builder.segment;
  output._builder.data = json._builder.data;
  output._builder.pointers = json._builder.pointers;
  output._builder.dataSize = json._builder.dataSize;
  output._builder.pointerCount = json._builder.pointerCount;
  output._builder._38_2_ = json._builder._38_2_;
  encode(this,&local_168,type,output);
  DynamicValue::Reader::~Reader(&local_168);
  capnp::_::StructBuilder::asReader(&json._builder);
  value_00._reader.capTable = (CapTableReader *)uStack_190;
  value_00._reader.segment = (SegmentReader *)local_198;
  value_00._reader.data = (void *)local_188;
  value_00._reader.pointers = (WirePointer *)uStack_180;
  value_00._reader._32_8_ = local_178;
  value_00._reader._40_8_ = uStack_170;
  encodeRaw(__return_storage_ptr__,this,value_00);
  MallocMessageBuilder::~MallocMessageBuilder(&message);
  return __return_storage_ptr__;
}

Assistant:

kj::String JsonCodec::encode(DynamicValue::Reader value, Type type) const {
  MallocMessageBuilder message;
  auto json = message.getRoot<JsonValue>();
  encode(value, type, json);
  return encodeRaw(json);
}